

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_video.c
# Opt level: O2

int main(int argc,char **argv)

{
  double dVar1;
  double dVar2;
  double dVar3;
  bool bVar4;
  ALLEGRO_FONT *pAVar5;
  char cVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  undefined4 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  long lVar16;
  char *pcVar17;
  int iVar18;
  uint uVar19;
  long lVar20;
  bool bVar21;
  float fVar22;
  float fVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  uint uVar27;
  undefined4 uVar28;
  ulong uVar29;
  undefined8 in_XMM4_Qa;
  undefined4 uVar30;
  double in_XMM5_Qa;
  undefined4 uVar31;
  ALLEGRO_EVENT event;
  
  cVar6 = al_install_system(0x5020700,atexit);
  if (cVar6 == '\0') {
    pcVar17 = "Could not init Allegro.\n";
  }
  else {
    if (argc < 2) {
      log_printf("This example needs to be run from the command line.\nUsage: %s [--use-frame-events] <file>\n"
                 ,*argv);
LAB_00102ca4:
      al_destroy_display(screen);
      return 0;
    }
    if (argc == 3) {
      iVar7 = strcmp(argv[1],"--use-frame-events");
      bVar21 = iVar7 == 0;
      lVar20 = (ulong)bVar21 + 1;
    }
    else {
      lVar20 = 1;
      bVar21 = false;
    }
    cVar6 = al_init_video_addon();
    if (cVar6 == '\0') {
      pcVar17 = "Could not initialize the video addon.\n";
    }
    else {
      al_init_font_addon();
      al_install_keyboard();
      al_install_audio();
      al_reserve_samples(1);
      al_init_primitives_addon();
      uVar13 = al_create_timer(0x11111111);
      al_set_new_display_flags(0x10);
      al_set_new_display_option(0x1a,1,2);
      screen = (ALLEGRO_DISPLAY *)al_create_display(0x280,0x1e0);
      if (screen == (ALLEGRO_DISPLAY *)0x0) {
        pcVar17 = "Could not set video mode - exiting\n";
      }
      else {
        font = (ALLEGRO_FONT *)al_create_builtin_font();
        if (font != (ALLEGRO_FONT *)0x0) {
          al_set_new_bitmap_flags(0xc0);
          filename = argv[lVar20];
          lVar20 = al_open_video();
          if (lVar20 != 0) {
            al_get_video_fps(lVar20);
            bVar4 = true;
            log_printf("video FPS: %f\n");
            al_get_video_audio_rate(lVar20);
            log_printf("video audio rate: %f\n");
            log_printf(
                      "keys:\nSpace: Play/Pause\ncursor right/left: seek 10 seconds\ncursor up/down: seek one minute\nF: toggle fullscreen\n1: disable scaling\nS: scale to window\n"
                      );
            uVar14 = al_create_event_queue();
            uVar15 = al_get_video_event_source(lVar20);
            al_register_event_source(uVar14,uVar15);
            uVar15 = al_get_display_event_source(screen);
            al_register_event_source(uVar14,uVar15);
            uVar15 = al_get_timer_event_source(uVar13);
            al_register_event_source(uVar14,uVar15);
            uVar15 = al_get_keyboard_event_source();
            al_register_event_source(uVar14,uVar15);
            uVar15 = al_get_default_mixer();
            al_start_video(lVar20,uVar15);
            al_start_timer(uVar13);
            uVar19 = 0;
switchD_00102bd7_caseD_4c:
            do {
              if (bVar4) {
                cVar6 = al_is_event_queue_empty(uVar14);
                bVar4 = true;
                if (cVar6 != '\0') {
                  fVar22 = (float)al_get_video_scaled_width(lVar20);
                  fVar23 = (float)al_get_video_scaled_height(lVar20);
                  lVar16 = al_get_video_frame(lVar20);
                  uVar28 = 0;
                  uVar24 = al_map_rgba_f(0,0,0,0x3f000000);
                  uVar26 = 0x3f000000;
                  uVar12 = 0;
                  uVar25 = al_map_rgba_f();
                  uVar31 = (undefined4)((ulong)in_XMM5_Qa >> 0x20);
                  uVar30 = (undefined4)((ulong)in_XMM4_Qa >> 0x20);
                  if (lVar16 == 0) goto LAB_0010289b;
                  if ((zoom != 0.0) || (NAN(zoom))) {
                    iVar18 = (int)fVar22;
                    iVar7 = (int)fVar23;
                  }
                  else {
                    iVar7 = al_get_display_height(screen);
                    iVar18 = (int)(((float)iVar7 * fVar22) / fVar23);
                    iVar8 = al_get_display_width(screen);
                    if (iVar8 < iVar18) {
                      iVar18 = al_get_display_width(screen);
                      iVar7 = (int)(((float)iVar18 * fVar23) / fVar22);
                    }
                  }
                  iVar8 = al_get_display_width(screen);
                  iVar9 = al_get_display_height(screen);
                  iVar10 = al_get_bitmap_width(lVar16);
                  iVar11 = al_get_bitmap_height(lVar16);
                  bVar4 = false;
                  uVar29 = (ulong)(uint)(float)iVar10;
                  al_draw_scaled_bitmap
                            (0,0,uVar29,CONCAT44(uVar12,(float)iVar11),
                             CONCAT44(uVar30,(float)((iVar8 - iVar18) / 2)),
                             CONCAT44(uVar31,(float)((iVar9 - iVar7) / 2)),(float)iVar18,
                             (float)iVar7,lVar16,0);
                  uVar12 = (undefined4)(uVar29 >> 0x20);
                  iVar7 = al_get_display_width(screen);
                  al_draw_filled_rounded_rectangle
                            (0x40800000,0x40800000,CONCAT44(uVar12,(float)(iVar7 + -4)),0x42700000,
                             0x41000000,0x41000000,uVar25,uVar26);
                  dVar1 = (double)al_get_video_position(lVar20,0);
                  al_draw_textf(uVar24,uVar28,0x41000000,0x41000000,font,0,"%s",filename);
                  pAVar5 = font;
                  dVar2 = (double)al_get_video_position(lVar20,1);
                  dVar3 = (double)al_get_video_position(lVar20,2);
                  al_draw_textf(uVar24,uVar28,0x41000000,0x41a80000,dVar2 - dVar1,dVar3 - dVar1,
                                pAVar5,0,"%3d:%02d (V: %+5.2f A: %+5.2f)",(int)(dVar1 / 60.0),
                                (long)(int)dVar1 % 0x3c & 0xffffffff);
                  pAVar5 = font;
                  in_XMM4_Qa = al_get_video_fps(lVar20);
                  uVar12 = al_get_bitmap_width(lVar16);
                  uVar25 = al_get_bitmap_height(lVar16);
                  in_XMM5_Qa = (double)(fVar22 / fVar23);
                  uVar26 = al_get_video_audio_rate(lVar20);
                  al_draw_textf(uVar24,uVar28,0x41000000,0x42080000,in_XMM4_Qa,in_XMM5_Qa,uVar26,
                                pAVar5,0,"video rate %.02f (%dx%d, aspect %.1f) audio rate %.0f",
                                uVar12,uVar25);
                  pAVar5 = font;
                  cVar6 = al_is_video_playing(lVar20);
                  pcVar17 = "false";
                  if (cVar6 != '\0') {
                    pcVar17 = "true";
                  }
                  al_draw_textf(uVar24,uVar28,0x41000000,0x423c0000,pAVar5,0,"playing: %s",pcVar17);
                  al_flip_display();
                  al_map_rgb(0,0,0);
                  al_clear_to_color();
                }
              }
              else {
LAB_0010289b:
                bVar4 = false;
              }
              al_wait_for_event(uVar14);
              if (event.type == 10) {
                uVar27 = 0xc0240000;
                switch(event.display.width) {
                case 0x4b:
                  al_is_video_playing(lVar20);
                  al_set_video_playing(lVar20);
                case 0x4c:
                case 0x4d:
                case 0x4e:
                case 0x4f:
                case 0x50:
                case 0x51:
                  goto switchD_00102bd7_caseD_4c;
                case 0x52:
                  break;
                case 0x53:
                  uVar27 = 0x40240000;
                  break;
                case 0x54:
                  uVar27 = 0x404e0000;
                  break;
                case 0x55:
                  uVar27 = 0xc04e0000;
                  break;
                default:
                  if (event.display.width == 6) {
                    uVar19 = uVar19 ^ 1;
                    al_set_display_flag(screen,0x200,uVar19);
                  }
                  else if (event.display.width == 0x13) {
                    zoom = 0.0;
                  }
                  else if (event.display.width == 0x1c) {
                    zoom = 1.0;
                  }
                  else if (event.display.width == 0x3b) goto LAB_00102c9c;
                  goto switchD_00102bd7_caseD_4c;
                }
                dVar1 = (double)al_get_video_position(lVar20);
                al_seek_video(SUB84(dVar1 + (double)((ulong)uVar27 << 0x20),0),lVar20);
                goto switchD_00102bd7_caseD_4c;
              }
              if (event.type == 0x1e) {
                bVar4 = (bool)(bVar4 | bVar21 ^ 1U);
                goto switchD_00102bd7_caseD_4c;
              }
              if (event.type == 0x29) {
                al_acknowledge_resize(screen);
                al_map_rgb(0,0,0);
                al_clear_to_color();
                goto switchD_00102bd7_caseD_4c;
              }
              if (event.type == 0x226) {
                bVar4 = (bool)(bVar4 | bVar21);
                goto switchD_00102bd7_caseD_4c;
              }
              if (event.type == 0x227) {
                log_printf("video finished\n");
                goto switchD_00102bd7_caseD_4c;
              }
            } while (event.type != 0x2a);
LAB_00102c9c:
            al_close_video(lVar20);
            goto LAB_00102ca4;
          }
          goto LAB_00102ced;
        }
        pcVar17 = "No font.\n";
      }
    }
  }
  abort_example(pcVar17);
LAB_00102ced:
  abort_example("Cannot read %s.\n",filename);
  iVar7 = __cxa_atexit();
  return iVar7;
}

Assistant:

int main(int argc, char *argv[])
{
   ALLEGRO_EVENT_QUEUE *queue;
   ALLEGRO_EVENT event;
   ALLEGRO_TIMER *timer;
   ALLEGRO_VIDEO *video;
   bool fullscreen = false;
   bool redraw = true;
   bool use_frame_events = false;
   int filename_arg_idx = 1;

   if (!al_init()) {
      abort_example("Could not init Allegro.\n");
   }

   open_log();

   if (argc < 2) {
      log_printf("This example needs to be run from the command line.\n"
                 "Usage: %s [--use-frame-events] <file>\n", argv[0]);
      goto done;
   }

   /* If use_frame_events is false, we use a fixed FPS timer. If the video is
    * displayed in a game this probably makes most sense. In a
    * dedicated video player you probably want to listen to
    * ALLEGRO_EVENT_VIDEO_FRAME_SHOW events and only redraw whenever one
    * arrives - to reduce possible jitter and save CPU.
    */
   if (argc == 3 && strcmp(argv[1], "--use-frame-events") == 0) {
      use_frame_events = true;
      filename_arg_idx++;
   }

   if (!al_init_video_addon()) {
      abort_example("Could not initialize the video addon.\n");
   }
   al_init_font_addon();
   al_install_keyboard();

   al_install_audio();
   al_reserve_samples(1);
   al_init_primitives_addon();

   timer = al_create_timer(1.0 / 60);

   al_set_new_display_flags(ALLEGRO_RESIZABLE);
   al_set_new_display_option(ALLEGRO_VSYNC, 1, ALLEGRO_SUGGEST);
   screen = al_create_display(640, 480);
   if (!screen) {
      abort_example("Could not set video mode - exiting\n");
   }
   
   font = al_create_builtin_font();
   if (!font) {
      abort_example("No font.\n");
   }

   al_set_new_bitmap_flags(ALLEGRO_MIN_LINEAR | ALLEGRO_MAG_LINEAR);

   filename = argv[filename_arg_idx];
   video = al_open_video(filename);
   if (!video) {
      abort_example("Cannot read %s.\n", filename);
   }
   log_printf("video FPS: %f\n", al_get_video_fps(video));
   log_printf("video audio rate: %f\n", al_get_video_audio_rate(video));
   log_printf(
      "keys:\n"
      "Space: Play/Pause\n"
      "cursor right/left: seek 10 seconds\n"
      "cursor up/down: seek one minute\n"
      "F: toggle fullscreen\n"
      "1: disable scaling\n"
      "S: scale to window\n");

   queue = al_create_event_queue();
   al_register_event_source(queue, al_get_video_event_source(video));
   al_register_event_source(queue, al_get_display_event_source(screen));
   al_register_event_source(queue, al_get_timer_event_source(timer));
   al_register_event_source(queue, al_get_keyboard_event_source());

   al_start_video(video, al_get_default_mixer());
   al_start_timer(timer);
   for (;;) {
      double incr;

      if (redraw && al_event_queue_is_empty(queue)) {
         video_display(video);
         redraw = false;
      }

      al_wait_for_event(queue, &event);
      switch (event.type) {
         case ALLEGRO_EVENT_KEY_DOWN:
            switch (event.keyboard.keycode) {
               case ALLEGRO_KEY_SPACE:
                  al_set_video_playing(video, !al_is_video_playing(video));
                  break;
               case ALLEGRO_KEY_ESCAPE:
                  al_close_video(video);
                  goto done;
                  break;
               case ALLEGRO_KEY_LEFT:
                  incr = -10.0;
                  goto do_seek;
               case ALLEGRO_KEY_RIGHT:
                  incr = 10.0;
                  goto do_seek;
               case ALLEGRO_KEY_UP:
                  incr = 60.0;
                  goto do_seek;
               case ALLEGRO_KEY_DOWN:
                  incr = -60.0;
                  goto do_seek;

               do_seek:
                  al_seek_video(video, al_get_video_position(video, ALLEGRO_VIDEO_POSITION_ACTUAL) + incr);
                  break;

               case ALLEGRO_KEY_F:
                  fullscreen = !fullscreen;
                  al_set_display_flag(screen, ALLEGRO_FULLSCREEN_WINDOW,
                     fullscreen);
                  break;
               
               case ALLEGRO_KEY_1:
                  zoom = 1;
                  break;

               case ALLEGRO_KEY_S:
                  zoom = 0;
                  break;
               default:
                  break;
            }
            break;
         
         case ALLEGRO_EVENT_DISPLAY_RESIZE:
            al_acknowledge_resize(screen);
            al_clear_to_color(al_map_rgb(0, 0, 0));
            break;

         case ALLEGRO_EVENT_TIMER:
            /*
            display_time += 1.0 / 60;
            if (display_time >= video_time) {
               video_time = display_time + video_refresh_timer(is);
            }*/

            if (!use_frame_events) {
               redraw = true;
            }
            break;

         case ALLEGRO_EVENT_DISPLAY_CLOSE:
            al_close_video(video);
            goto done;
            break;

         case ALLEGRO_EVENT_VIDEO_FRAME_SHOW:
            if (use_frame_events) {
               redraw = true;
            }
            break;

         case ALLEGRO_EVENT_VIDEO_FINISHED:
            log_printf("video finished\n");
            break;
         default:
            break;
      }
   }
done:
   al_destroy_display(screen);
   close_log(true);
   return 0;
}